

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileJsonObject(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken **ppNext;
  SyToken *pSVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  char *zFormat;
  sxu32 nLine;
  SyToken *pSVar4;
  SyToken *pSVar5;
  SyToken *pTmpIn;
  SyToken *pSVar6;
  int local_34;
  
  ppNext = &pGen->pIn;
  pSVar1 = pGen->pIn;
  pGen->pIn = pSVar1 + 1;
  pSVar5 = pGen->pEnd + -1;
  pGen->pEnd = pSVar5;
  local_34 = 0;
  pSVar1 = pSVar1 + 1;
  while( true ) {
    while ((pSVar1 < pSVar5 && ((pSVar1->nType & 0x20000) != 0))) {
      *ppNext = pSVar1 + 1;
      pSVar1 = pSVar1 + 1;
    }
    sVar3 = jx9GetNextExpr(pSVar1,pSVar5,ppNext);
    if (sVar3 != 0) {
      jx9VmEmitInstr(pGen->pVm,6,local_34 * 2,1,(void *)0x0,(sxu32 *)0x0);
      return 0;
    }
    pSVar6 = *ppNext;
    pSVar4 = pSVar1;
    do {
      pSVar5 = pSVar4;
      if (pSVar6 <= pSVar5) {
        if ((pSVar5->nType & 0x100000) != 0) {
          pSVar4 = pSVar1;
          if (pSVar1 == pSVar5) {
            jx9GenCompileError(pGen,1,pSVar5->nLine,"JSON Object: Missing entry key");
            pSVar4 = pSVar5 + 1;
            pSVar6 = pGen->pIn;
          }
          goto LAB_001294c8;
        }
        nLine = pSVar5->nLine;
        zFormat = "JSON Object: Missing colon string \":\"";
        sVar3 = -1;
        goto LAB_00129562;
      }
      pSVar4 = pSVar5 + 1;
    } while ((pSVar5->nType & 0x100000) == 0);
    if (pSVar6 <= pSVar4) break;
    pSVar2 = pGen->pEnd;
    pGen->pIn = pSVar1;
    pGen->pEnd = pSVar5;
    sVar3 = jx9CompileExpr(pGen,2,GenStateJSONObjectKeyNodeValidator);
    pGen->pIn = pSVar6;
    pGen->pEnd = pSVar2;
    if (sVar3 == -10) {
      return -10;
    }
LAB_001294c8:
    pSVar5 = pGen->pEnd;
    pGen->pIn = pSVar4;
    pGen->pEnd = pSVar6;
    sVar3 = jx9CompileExpr(pGen,2,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    pGen->pIn = pSVar6;
    pGen->pEnd = pSVar5;
    if (sVar3 == -10) {
      return -10;
    }
    local_34 = local_34 + 1;
    pSVar1 = pSVar6;
  }
  nLine = pSVar5->nLine;
  zFormat = "JSON Object: Missing entry value";
  sVar3 = 1;
LAB_00129562:
  sVar3 = jx9GenCompileError(pGen,sVar3,nLine,zFormat);
  if (sVar3 == -10) {
    return -10;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileJsonObject(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	SyToken *pKey, *pCur;
	sxi32 nPair = 0;
	sxi32 rc;

	pGen->pIn++; /* Jump the open querly braces '{'*/
	pGen->pEnd--;
	SXUNUSED(iCompileFlag); /* cc warning */
	for(;;){
		/* Jump leading commas */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_COMMA) ){
			pGen->pIn++;
		}
		pCur = pGen->pIn;
		if( SXRET_OK != jx9GetNextExpr(pGen->pIn, pGen->pEnd, &pGen->pIn) ){
			/* No more entry to process */
			break;
		}
		/* Compile the key */
		pKey = pCur;
		while( pCur < pGen->pIn ){
			if( pCur->nType & JX9_TK_COLON /*':'*/  ){
				break;
			}
			pCur++;
		}
		rc = SXERR_EMPTY;
		if( (pCur->nType & JX9_TK_COLON) == 0 ){
			rc = jx9GenCompileError(&(*pGen), E_ABORT, pCur->nLine, "JSON Object: Missing colon string \":\"");
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			return SXRET_OK;
		}

		if( pCur < pGen->pIn ){
			if( &pCur[1] >= pGen->pIn ){
				/* Missing value */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pCur->nLine, "JSON Object: Missing entry value");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
				return SXRET_OK;
			}
			/* Compile the expression holding the key */
			rc = GenStateCompileJSONEntry(&(*pGen), pKey, pCur,
				EXPR_FLAG_RDONLY_LOAD                /* Do not create the variable if inexistant */, 
				GenStateJSONObjectKeyNodeValidator   /* Node validator callback */
				);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			pCur++; /* Jump the double colon ':'  */
		}else if( pKey == pCur ){
			/* Key is omitted, emit an error */
			jx9GenCompileError(&(*pGen),E_ERROR, pCur->nLine, "JSON Object: Missing entry key");
			pCur++; /* Jump the double colon ':'  */
		}else{
			/* Reset back the cursor and point to the entry value */
			pCur = pKey;
		}
		/* Compile indice value */
		rc = GenStateCompileJSONEntry(&(*pGen), pCur, pGen->pIn, EXPR_FLAG_RDONLY_LOAD/*Do not create the variable if inexistant*/,0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		nPair++;
	}
	/* Emit the load map instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOAD_MAP, nPair * 2, 1, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}